

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

string * __thiscall
VolumeFile::getEntryPath
          (string *__return_storage_ptr__,VolumeFile *this,EntryKey *entryKey,string *prefix)

{
  bool bVar1;
  StringKey extKey;
  StringKey nameKey;
  StringBTree extBtree;
  StringBTree nameBtree;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  nameBtree.super_BTree<StringBTree,_StringKey>.m_data =
       (BTree<StringBTree,_StringKey>)
       ((this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + this->m_nameTreeOffset);
  nameKey.m_value = (char *)0x0;
  nameKey.m_length = 0;
  bVar1 = BTree<StringBTree,_StringKey>::searchByIndex
                    (&nameBtree.super_BTree<StringBTree,_StringKey>,entryKey->m_nameIndex,&nameKey);
  if (bVar1) {
    std::__cxx11::string::append<char_const*,void>
              ((string *)__return_storage_ptr__,nameKey.m_value,nameKey.m_value + nameKey.m_length);
  }
  if ((entryKey->m_flags & 2) == 0) {
    if ((entryKey->m_flags & 1) != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  else {
    extBtree.super_BTree<StringBTree,_StringKey>.m_data =
         (BTree<StringBTree,_StringKey>)
         ((this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + this->m_extTreeOffset);
    extKey.m_value = (char *)0x0;
    extKey.m_length = 0;
    bVar1 = BTree<StringBTree,_StringKey>::searchByIndex
                      (&extBtree.super_BTree<StringBTree,_StringKey>,entryKey->m_extIndex,&extKey);
    if ((bVar1) && ((ulong)extKey.m_length != 0)) {
      std::__cxx11::string::append<char_const*,void>
                ((string *)__return_storage_ptr__,extKey.m_value,extKey.m_value + extKey.m_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VolumeFile::getEntryPath(const EntryKey& entryKey, const std::string& prefix) const
{
	std::string path(prefix);

	StringBTree nameBtree(
		advancePointer(m_data.data(), nameTreeOffset())
	);
	StringKey nameKey;
	if (nameBtree.searchByIndex(entryKey.nameIndex(), nameKey)) {
		path.append(nameKey.value(), nameKey.value() + nameKey.length());
	}

	if (entryKey.isFile()) {
		StringBTree extBtree(
			advancePointer(m_data.data(), extTreeOffset())
		);
		StringKey extKey;
		if (extBtree.searchByIndex(entryKey.extIndex(), extKey)) {
			if (extKey.length() > 0) {
				path.append(extKey.value(), extKey.value() + extKey.length());
			}
		}
	} else if (entryKey.isDirectory()) {
		path += '/';
	}

	return path;
}